

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfFastHuf.cpp
# Opt level: O0

void __thiscall
Imf_2_5::FastHufDecoder::refill
          (FastHufDecoder *this,Int64 *buffer,int numBits,Int64 *bufferBack,int *bufferBackNumBits,
          uchar **currByte,int *currBitsLeft)

{
  Int64 shift;
  uchar **currByte_local;
  int *bufferBackNumBits_local;
  Int64 *bufferBack_local;
  int numBits_local;
  Int64 *buffer_local;
  FastHufDecoder *this_local;
  
  *buffer = *bufferBack >> (0x40U - (char)numBits & 0x3f) | *buffer;
  numBits_local = numBits;
  if (*bufferBackNumBits < numBits) {
    numBits_local = numBits - *bufferBackNumBits;
    if (*currBitsLeft < 0x40) {
      *bufferBack = 0;
      *bufferBackNumBits = 0x40;
      shift = 0x38;
      while (0 < *currBitsLeft) {
        *bufferBack = (ulong)**currByte << ((byte)shift & 0x3f) | *bufferBack;
        *currByte = *currByte + 1;
        shift = shift - 8;
        *currBitsLeft = *currBitsLeft + -8;
      }
      if (*currBitsLeft < 0) {
        *currBitsLeft = 0;
      }
    }
    else {
      *bufferBack = (ulong)**currByte << 0x38 | (ulong)(*currByte)[1] << 0x30 |
                    (ulong)(*currByte)[2] << 0x28 | (ulong)(*currByte)[3] << 0x20 |
                    (ulong)(*currByte)[4] << 0x18 | (ulong)(*currByte)[5] << 0x10 |
                    (ulong)(*currByte)[6] << 8 | (ulong)(*currByte)[7];
      *bufferBackNumBits = 0x40;
      *currByte = *currByte + 8;
      *currBitsLeft = *currBitsLeft + -0x40;
    }
    *buffer = *bufferBack >> (0x40U - (char)numBits_local & 0x3f) | *buffer;
  }
  *bufferBack = *bufferBack << ((byte)numBits_local & 0x3f);
  *bufferBackNumBits = *bufferBackNumBits - numBits_local;
  if (*bufferBackNumBits == 0) {
    *bufferBack = 0;
  }
  return;
}

Assistant:

inline void
FastHufDecoder::refill
    (Int64 &buffer,
     int numBits,                       // number of bits to refill
     Int64 &bufferBack,                 // the next 64-bits, to refill from
     int &bufferBackNumBits,            // number of bits left in bufferBack
     const unsigned char *&currByte,    // current byte in the bitstream
     int &currBitsLeft)                 // number of bits left in the bitsream
{
    // 
    // Refill bits into the bottom of buffer, from the top of bufferBack.
    // Always top up buffer to be completely full.
    //

    buffer |= bufferBack >> (64 - numBits);

    if (bufferBackNumBits < numBits)
    {
        numBits -= bufferBackNumBits;

        // 
        // Refill all of bufferBack from the bitstream. Either grab
        // a full 64-bit chunk, or whatever bytes are left. If we
        // don't have 64-bits left, pad with 0's.
        //

        if (currBitsLeft >= 64)
        {
            bufferBack        = READ64 (currByte); 
            bufferBackNumBits = 64;
            currByte         += sizeof (Int64);
            currBitsLeft     -= 8 * sizeof (Int64);

        }
        else
        {
            bufferBack        = 0;
            bufferBackNumBits = 64; 

            Int64 shift = 56;
            
            while (currBitsLeft > 0)
            {
                bufferBack |= ((Int64)(*currByte)) << shift;

                currByte++;
                shift        -= 8;
                currBitsLeft -= 8;
            }

            //
            // At this point, currBitsLeft might be negative, just because
            // we're subtracting whole bytes. To keep anyone from freaking
            // out, zero the counter.
            //

            if (currBitsLeft < 0)
                currBitsLeft = 0;
        }

        buffer |= bufferBack >> (64 - numBits);
    }
    
    bufferBack         = bufferBack << numBits;
    bufferBackNumBits -= numBits;

    // 
    // We can have cases where the previous shift of bufferBack is << 64 - 
    // in which case no shift occurs. The bit count math still works though,
    // so if we don't have any bits left, zero out bufferBack.
    //

    if (bufferBackNumBits == 0)
        bufferBack = 0;
}